

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O0

void __thiscall
CConsoleNetConnection::Init(CConsoleNetConnection *this,NETSOCKET Socket,NETADDR *pAddr)

{
  undefined4 uVar1;
  long lVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  NETSOCKET sock;
  uint *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  CConsoleNetConnection *in_RDI;
  long in_FS_OFFSET;
  int iVar7;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = (int)((ulong)in_RDI >> 0x20);
  Reset(in_RDI);
  (in_RDI->m_Socket).ipv6sock = in_EDX;
  (in_RDI->m_Socket).type = (int)in_RSI;
  (in_RDI->m_Socket).ipv4sock = (int)((ulong)in_RSI >> 0x20);
  uVar1 = (in_RDI->m_Socket).type;
  uVar3 = (in_RDI->m_Socket).ipv4sock;
  sock.ipv6sock = uVar3;
  sock.ipv4sock = uVar1;
  sock.type = iVar7;
  net_set_non_blocking(sock);
  *(undefined8 *)((in_RDI->m_PeerAddr).ip + 0xc) = *(undefined8 *)(in_RCX + 4);
  uVar4 = in_RCX[1];
  uVar5 = in_RCX[2];
  uVar6 = in_RCX[3];
  (in_RDI->m_PeerAddr).type = *in_RCX;
  *(uint *)(in_RDI->m_PeerAddr).ip = uVar4;
  *(uint *)((in_RDI->m_PeerAddr).ip + 4) = uVar5;
  *(uint *)((in_RDI->m_PeerAddr).ip + 8) = uVar6;
  in_RDI->m_State = 4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsoleNetConnection::Init(NETSOCKET Socket, const NETADDR *pAddr)
{
	Reset();

	m_Socket = Socket;
	net_set_non_blocking(m_Socket);

	m_PeerAddr = *pAddr;
	m_State = NET_CONNSTATE_ONLINE;
}